

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O2

int __thiscall ncnn::ObjectsManager::get_prob_index(ObjectsManager *this,float prob)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->step;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(int)(prob * 100.0);
  uVar4 = SUB168(auVar2 / auVar1,0) & 0xffffffff;
  if (SUB164(auVar2 / auVar1,0) < 1) {
    uVar4 = 0;
  }
  iVar3 = (int)uVar4;
  if (this->prob_steps <= uVar4) {
    iVar3 = (int)this->prob_steps + -1;
  }
  return iVar3;
}

Assistant:

inline int ObjectsManager::get_prob_index(float prob)
{
    int index = (int)(prob * 100) / step;
    index = index < 0 ? 0 : index;
    index = index < prob_steps ? index : prob_steps - 1;
    return index;
}